

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O2

int ibuf_add(ibuf *buf,void *data,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = buf->wpos;
  if (buf->size < sVar2 + len) {
    iVar1 = ibuf_realloc(buf,len);
    if (iVar1 == -1) {
      return -1;
    }
    sVar2 = buf->wpos;
  }
  memcpy(buf->buf + sVar2,data,len);
  buf->wpos = buf->wpos + len;
  return 0;
}

Assistant:

int
ibuf_add(struct ibuf *buf, const void *data, size_t len)
{
	if (buf->wpos + len > buf->size)
		if (ibuf_realloc(buf, len) == -1)
			return (-1);

	memcpy(buf->buf + buf->wpos, data, len);
	buf->wpos += len;
	return (0);
}